

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O1

aiMesh * __thiscall
Assimp::X3DImporter::GeometryHelper_MakeMesh
          (X3DImporter *this,vector<int,_std::allocator<int>_> *pCoordIdx,
          list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pVertices)

{
  _List_node_base *p_Var1;
  undefined1 auVar2 [16];
  _List_node_base *p_Var3;
  pointer paVar4;
  aiMesh *paVar5;
  ulong *puVar6;
  aiVector3D *paVar7;
  runtime_error *this_00;
  aiFace *paVar8;
  long lVar9;
  ulong uVar10;
  _Self __tmp;
  _List_node_base *p_Var11;
  ulong uVar12;
  uint prim_type;
  vector<aiFace,_std::allocator<aiFace>_> faces;
  uint local_8c;
  vector<aiFace,_std::allocator<aiFace>_> local_88;
  aiVector3D **local_68;
  list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *local_60;
  pointer local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_88.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_88.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_88.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_8c = 0;
  GeometryHelper_CoordIdxStr2FacesArr(this,pCoordIdx,&local_88,&local_8c);
  paVar4 = local_88.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar9 = (long)local_88.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_88.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                super__Vector_impl_data._M_start;
  uVar12 = (long)local_88.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_88.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                 super__Vector_impl_data._M_start;
  if (uVar12 == 0) {
LAB_00618100:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"Failed to create mesh, faces list is empty.","");
    std::runtime_error::runtime_error(this_00,(string *)local_50);
    *(undefined ***)this_00 = &PTR__runtime_error_007fa260;
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_58 = local_88.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_60 = pVertices;
  paVar5 = (aiMesh *)operator_new(0x520);
  uVar10 = lVar9 >> 4;
  paVar5->mPrimitiveTypes = 0;
  paVar5->mNumVertices = 0;
  paVar5->mNumFaces = 0;
  local_68 = &paVar5->mVertices;
  memset(local_68,0,0xcc);
  paVar5->mBones = (aiBone **)0x0;
  paVar5->mMaterialIndex = 0;
  (paVar5->mName).length = 0;
  (paVar5->mName).data[0] = '\0';
  memset((paVar5->mName).data + 1,0x1b,0x3ff);
  paVar5->mNumAnimMeshes = 0;
  paVar5->mAnimMeshes = (aiAnimMesh **)0x0;
  paVar5->mMethod = 0;
  (paVar5->mAABB).mMin.x = 0.0;
  (paVar5->mAABB).mMin.y = 0.0;
  (paVar5->mAABB).mMin.z = 0.0;
  (paVar5->mAABB).mMax.x = 0.0;
  (paVar5->mAABB).mMax.y = 0.0;
  (paVar5->mAABB).mMax.z = 0.0;
  paVar5->mTextureCoords[0] = (aiVector3D *)0x0;
  paVar5->mTextureCoords[1] = (aiVector3D *)0x0;
  paVar5->mTextureCoords[2] = (aiVector3D *)0x0;
  paVar5->mTextureCoords[3] = (aiVector3D *)0x0;
  paVar5->mTextureCoords[4] = (aiVector3D *)0x0;
  paVar5->mTextureCoords[5] = (aiVector3D *)0x0;
  paVar5->mTextureCoords[6] = (aiVector3D *)0x0;
  paVar5->mTextureCoords[7] = (aiVector3D *)0x0;
  paVar5->mNumUVComponents[0] = 0;
  paVar5->mNumUVComponents[1] = 0;
  paVar5->mNumUVComponents[2] = 0;
  paVar5->mNumUVComponents[3] = 0;
  paVar5->mNumUVComponents[4] = 0;
  paVar5->mNumUVComponents[5] = 0;
  paVar5->mNumUVComponents[6] = 0;
  paVar5->mNumUVComponents[7] = 0;
  paVar5->mColors[0] = (aiColor4D *)0x0;
  paVar5->mColors[1] = (aiColor4D *)0x0;
  paVar5->mColors[2] = (aiColor4D *)0x0;
  paVar5->mColors[3] = (aiColor4D *)0x0;
  paVar5->mColors[4] = (aiColor4D *)0x0;
  paVar5->mColors[5] = (aiColor4D *)0x0;
  paVar5->mColors[6] = (aiColor4D *)0x0;
  paVar5->mColors[7] = (aiColor4D *)0x0;
  puVar6 = (ulong *)operator_new__(-(ulong)(uVar10 >> 0x3c != 0) | uVar12 | 8);
  *puVar6 = uVar10;
  paVar8 = (aiFace *)(puVar6 + 1);
  do {
    paVar8->mNumIndices = 0;
    paVar8->mIndices = (uint *)0x0;
    paVar8 = paVar8 + 1;
  } while (paVar8 != (aiFace *)((long)puVar6 + uVar12 + 8));
  paVar5->mFaces = (aiFace *)(puVar6 + 1);
  paVar5->mNumFaces = (uint)uVar10;
  if (paVar4 != local_58) {
    lVar9 = 0;
    uVar12 = 0;
    do {
      if ((ulong)((long)local_88.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_88.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                        super__Vector_impl_data._M_start >> 4) <= uVar12) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar12);
        goto LAB_00618100;
      }
      aiFace::operator=((aiFace *)((long)&paVar5->mFaces->mNumIndices + lVar9),
                        (aiFace *)
                        ((long)&(local_88.super__Vector_base<aiFace,_std::allocator<aiFace>_>.
                                 _M_impl.super__Vector_impl_data._M_start)->mNumIndices + lVar9));
      uVar12 = uVar12 + 1;
      lVar9 = lVar9 + 0x10;
    } while (uVar10 + (uVar10 == 0) != uVar12);
  }
  p_Var11 = (local_60->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl._M_node.super__List_node_base._M_next;
  uVar12 = (local_60->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl._M_node._M_size;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar12;
  uVar10 = 0xffffffffffffffff;
  if (SUB168(auVar2 * ZEXT816(0xc),8) == 0) {
    uVar10 = SUB168(auVar2 * ZEXT816(0xc),0);
  }
  paVar7 = (aiVector3D *)operator_new__(uVar10);
  if (uVar12 != 0) {
    memset(paVar7,0,((uVar12 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
  }
  paVar5->mVertices = paVar7;
  paVar5->mNumVertices = (uint)uVar12;
  if (uVar12 != 0) {
    paVar7 = *local_68;
    do {
      p_Var1 = p_Var11[1]._M_next;
      p_Var3 = p_Var11 + 1;
      p_Var11 = p_Var11->_M_next;
      paVar7->z = *(float *)&p_Var3->_M_prev;
      *(_List_node_base **)paVar7 = p_Var1;
      paVar7 = paVar7 + 1;
      uVar12 = uVar12 - 1;
    } while (uVar12 != 0);
  }
  paVar5->mPrimitiveTypes = local_8c;
  std::vector<aiFace,_std::allocator<aiFace>_>::~vector(&local_88);
  return paVar5;
}

Assistant:

aiMesh* X3DImporter::GeometryHelper_MakeMesh(const std::vector<int32_t>& pCoordIdx, const std::list<aiVector3D>& pVertices) const
{
    std::vector<aiFace> faces;
    unsigned int prim_type = 0;

	// create faces array from input string with vertices indices.
	GeometryHelper_CoordIdxStr2FacesArr(pCoordIdx, faces, prim_type);
    if ( !faces.size() )
    {
        throw DeadlyImportError( "Failed to create mesh, faces list is empty." );
    }

	//
	// Create new mesh and copy geometry data.
	//
    aiMesh *tmesh = new aiMesh;
    size_t ts = faces.size();
	// faces
	tmesh->mFaces = new aiFace[ts];
	tmesh->mNumFaces = static_cast<unsigned int>(ts);
	for(size_t i = 0; i < ts; i++) tmesh->mFaces[i] = faces.at(i);

	// vertices
	std::list<aiVector3D>::const_iterator vit = pVertices.begin();

	ts = pVertices.size();
	tmesh->mVertices = new aiVector3D[ts];
	tmesh->mNumVertices = static_cast<unsigned int>(ts);
    for ( size_t i = 0; i < ts; i++ )
    {
        tmesh->mVertices[ i ] = *vit++;
    }

	// set primitives type and return result.
	tmesh->mPrimitiveTypes = prim_type;

	return tmesh;
}